

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void H3(picnic_instance_t *pp,sig_proof_t *prf,picnic_context_t *context)

{
  long in_RDX;
  uint8_t hash [64];
  hash_context ctx;
  uint num_rounds;
  picnic_context_t *in_stack_fffffffffffffeb8;
  hash_context *in_stack_fffffffffffffec0;
  picnic_instance_t *in_stack_fffffffffffffec8;
  hash_context *in_stack_fffffffffffffed0;
  uint8_t *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  picnic_instance_t *in_stack_ffffffffffffffc0;
  
  hash_init_prefix(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,'\0');
  hash_update(in_stack_fffffffffffffec0,(uint8_t *)in_stack_fffffffffffffeb8,0x13e153);
  hash_update(in_stack_fffffffffffffec0,(uint8_t *)in_stack_fffffffffffffeb8,0x13e184);
  if ((*(byte *)(in_RDX + 0x68) & 1) != 0) {
    hash_update(in_stack_fffffffffffffec0,(uint8_t *)in_stack_fffffffffffffeb8,0x13e1d9);
  }
  H3_public_key_message
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (uint8_t *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  hash_final((hash_context *)0x13e205);
  memset(&stack0xfffffffffffffeb8,0,0x40);
  hash_squeeze(in_stack_fffffffffffffec0,(uint8_t *)in_stack_fffffffffffffeb8,0x13e22f);
  H3_compute(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void H3(const picnic_instance_t* pp, sig_proof_t* prf, const picnic_context_t* context) {
  const unsigned int num_rounds = pp->num_rounds;

  hash_context ctx;
  hash_init_prefix(&ctx, pp->digest_size, HASH_PREFIX_1);

  // hash output shares
  hash_update(&ctx, prf->round[0].output_shares[0], pp->input_output_size * num_rounds * SC_PROOF);
  // hash all commitments C
  hash_update(&ctx, prf->round[0].commitments[0], pp->digest_size * num_rounds * SC_PROOF);
#if defined(WITH_UNRUH)
  if (context->unruh) {
    // hash all commitments G
    hash_update(&ctx, prf->round[0].gs[0],
                num_rounds * (SC_PROOF * pp->view_size + (SC_PROOF + 1) * pp->input_output_size));
  }
#endif
  // hash public key, salt, and message
  H3_public_key_message(&ctx, pp, prf->salt, context);
  hash_final(&ctx);

  uint8_t hash[MAX_DIGEST_SIZE] = {0};
  hash_squeeze(&ctx, hash, pp->digest_size);
  hash_clear(&ctx);
  /* parts of this hash will be published as challenge so is public anyway */
  picnic_declassify(hash, MAX_DIGEST_SIZE);
  H3_compute(pp, hash, prf->challenge);
}